

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_info_cleanup(LodePNGInfo *info)

{
  lodepng_color_mode_cleanup((LodePNGColorMode *)0x1064d2);
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);
  lodepng_clear_icc((LodePNGInfo *)0x1064ed);
  LodePNGUnknownChunks_cleanup(info);
  return;
}

Assistant:

void lodepng_info_cleanup(LodePNGInfo* info)
{
  lodepng_color_mode_cleanup(&info->color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);

  lodepng_clear_icc(info);

  LodePNGUnknownChunks_cleanup(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}